

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall ConfigTest_read_object_Test::TestBody(ConfigTest_read_object_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_158 [8];
  Message local_150 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_148;
  string local_128 [32];
  object local_108;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_c8;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  allocator<char> local_81;
  string local_80;
  path local_60;
  undefined1 local_38 [8];
  path file_path;
  ConfigTest_read_object_Test *this_local;
  
  file_path._32_8_ = this;
  std::filesystem::__cxx11::path::path<char[17],std::filesystem::__cxx11::path>
            (&local_60,(char (*) [17])"read_object.test",auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"some_data",&local_81);
  make_tmp_file((path *)local_38,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::__cxx11::string::string(local_128);
  jessilib::config::read_object((path *)&local_108,(string *)local_38,(text_encoding)local_128);
  std::__cxx11::u8string::u8string((u8string *)&local_148);
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_c8,&local_108,&local_148);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t[10],_nullptr>
            ((EqHelper *)local_a8,"config::read_object(file_path).get<std::u8string>()",
             "u8\"some_data\"",&local_c8,(char8_t (*) [10])"some_data");
  std::__cxx11::u8string::~u8string((u8string *)&local_c8);
  std::__cxx11::u8string::~u8string((u8string *)&local_148);
  jessilib::object::~object(&local_108);
  std::__cxx11::string::~string(local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::filesystem::__cxx11::path::~path((path *)local_38);
  return;
}

Assistant:

TEST(ConfigTest, read_object) {
	std::filesystem::path file_path = make_tmp_file("read_object.test", "some_data");
	EXPECT_EQ(config::read_object(file_path).get<std::u8string>(), u8"some_data");
}